

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

bool GetControl<unsigned_int>(Services *OS,char *name,uint *value)

{
  bool bVar1;
  undefined1 uVar2;
  allocator local_4d;
  uint readValue;
  string local_48;
  
  readValue = 0;
  std::__cxx11::string::string((string *)&local_48,name,&local_4d);
  bVar1 = ::OS::Services_Common::GetControl(&OS->super_Services_Common,&local_48,&readValue,4);
  uVar2 = std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    uVar2 = (undefined1)readValue;
    *value = readValue;
  }
  return (bool)uVar2;
}

Assistant:

static bool GetControl(
    const OS::Services& OS,
    const char* name,
    T& value )
{
    unsigned int    readValue = 0;
    bool success = OS.GetControl( name, &readValue, sizeof(readValue) );
    if( success )
    {
        value = readValue;
    }

    return success;
}